

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_color_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color color,rf_color *dst,
          rf_int dst_size)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  
  auVar1 = _DAT_00177b60;
  if (0 < dst_size) {
    lVar2 = dst_size + -1;
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00177b60;
    auVar6 = _DAT_00177d50;
    auVar7 = _DAT_00177d60;
    do {
      auVar8 = auVar7 ^ auVar1;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar8._4_4_ == iVar5 && auVar4._0_4_ < auVar8._0_4_ || iVar5 < auVar8._4_4_) & 1
                )) {
        dst[uVar3] = color;
      }
      if ((auVar8._12_4_ != auVar4._12_4_ || auVar8._8_4_ <= auVar4._8_4_) &&
          auVar8._12_4_ <= auVar4._12_4_) {
        dst[uVar3 + 1] = color;
      }
      auVar8 = auVar6 ^ auVar1;
      iVar9 = auVar8._4_4_;
      if (iVar9 <= iVar5 && (iVar9 != iVar5 || auVar8._0_4_ <= auVar4._0_4_)) {
        dst[uVar3 + 2] = color;
        dst[uVar3 + 3] = color;
      }
      uVar3 = uVar3 + 4;
      lVar2 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar2 + 4;
      lVar2 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar2 + 4;
    } while ((dst_size + 3U & 0xfffffffffffffffc) != uVar3);
  }
  __return_storage_ptr__->data = dst;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
  __return_storage_ptr__->valid = true;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_to_buffer(int width, int height, rf_color color, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    for (rf_int i = 0; i < dst_size; i++)
    {
        dst[i] = color;
    }

    return (rf_image) {
        .data   = dst,
        .width  = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid  = true,
    };
}